

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O2

void __thiscall spvtools::opt::Loop::SetLatchBlock(Loop *this,BasicBlock *latch)

{
  bool bVar1;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  if (latch->function_ == (Function *)0x0) {
    __assert_fail("latch->GetParent() && \"The basic block does not belong to a function\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                  ,0x123,"void spvtools::opt::Loop::SetLatchBlock(BasicBlock *)");
  }
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp:294:38)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp:294:38)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  BasicBlock::ForEachSuccessorLabel(latch,(function<void_(unsigned_int)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  bVar1 = IsInsideLoop(this,latch);
  if (bVar1) {
    this->loop_latch_ = latch;
    return;
  }
  __assert_fail("IsInsideLoop(latch) && \"The continue block is not in the loop\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                ,299,"void spvtools::opt::Loop::SetLatchBlock(BasicBlock *)");
}

Assistant:

void Loop::SetLatchBlock(BasicBlock* latch) {
#ifndef NDEBUG
  assert(latch->GetParent() && "The basic block does not belong to a function");

  const auto* const_latch = latch;
  const_latch->ForEachSuccessorLabel([this](uint32_t id) {
    assert((!IsInsideLoop(id) || id == GetHeaderBlock()->id()) &&
           "A predecessor of the continue block does not belong to the loop");
  });
#endif  // NDEBUG
  assert(IsInsideLoop(latch) && "The continue block is not in the loop");

  SetLatchBlockImpl(latch);
}